

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:110:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:110:17)>
             *this)

{
  Own<kj::PromiseFulfiller<unsigned_int>,_std::nullptr_t> *pOVar1;
  Disposer *pDVar2;
  PromiseFulfiller<unsigned_int> *pPVar3;
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *pMVar4;
  PromiseBase node;
  long *plVar5;
  WeakFulfiller<unsigned_int> *params;
  Executor *pEVar6;
  WeakFulfillerBase *pWVar7;
  long in_FS_OFFSET;
  PromiseFulfillerPair<unsigned_int> paf;
  DebugComparison<unsigned_int,_int> _kjCondition;
  WaitScope waitScope;
  Fault f;
  EventLoop loop;
  UnixEventPort port;
  char local_219;
  PromiseBase local_218;
  WeakFulfillerBase *local_210;
  long *local_208;
  OwnPromiseNode local_200;
  char *local_1f8;
  Maybe<const_kj::Executor_&> *local_1f0;
  bool local_1e8;
  char *local_1e0;
  char *pcStack_1d8;
  undefined8 local_1d0;
  EventLoop *local_1c8;
  undefined4 local_1c0;
  long local_1b8;
  undefined8 uStack_1b0;
  Fault local_1a8 [2];
  EventLoop local_198;
  UnixEventPort local_120;
  
  *(undefined1 *)(in_FS_OFFSET + -0x43) = 1;
  UnixEventPort::UnixEventPort(&local_120);
  EventLoop::EventLoop(&local_198,&local_120.super_EventPort);
  local_1c0 = 0xffffffff;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = &local_198;
  EventLoop::enterScope(&local_198);
  params = (WeakFulfiller<unsigned_int> *)operator_new(0x18);
  pWVar7 = &params->super_WeakFulfillerBase;
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<unsigned_int>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_0062cef0;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_0062cf28;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<unsigned_int>&>
            ((PromiseDisposer *)&local_200,params);
  local_218.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_200.ptr;
  pOVar1 = (this->f).fulfiller;
  pDVar2 = pOVar1->disposer;
  pPVar3 = pOVar1->ptr;
  pOVar1->disposer = &pWVar7->super_Disposer;
  pOVar1->ptr = (PromiseFulfiller<unsigned_int> *)params;
  local_208 = (long *)0x0;
  local_210 = pWVar7;
  if (pPVar3 != (PromiseFulfiller<unsigned_int> *)0x0) {
    (**pDVar2->_vptr_Disposer)();
  }
  pEVar6 = getCurrentThreadExecutor();
  pMVar4 = (this->f).executor;
  local_200.ptr = (PromiseNode *)((ulong)local_200.ptr & 0xffffffffffffff00);
  kj::_::Mutex::lock(&pMVar4->mutex,0,(DebugComparison<unsigned_int,_int> *)&local_200);
  (pMVar4->value).ptr = pEVar6;
  kj::_::Mutex::unlock(&pMVar4->mutex,EXCLUSIVE,(Waiter *)0x0);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  pcStack_1d8 = "operator()";
  local_1d0 = 0x3100000078;
  local_200.ptr._0_4_ = Promise<unsigned_int>::wait((Promise<unsigned_int> *)&local_218,&local_1c8);
  local_200.ptr._4_4_ = 0x7b;
  local_1f8 = " == ";
  local_1f0 = (Maybe<const_kj::Executor_&> *)0x5;
  local_1e8 = (__pid_t)local_200.ptr == 0x7b;
  if (local_1e8) {
    pMVar4 = (this->f).executor;
    local_200.ptr = (PromiseNode *)((ulong)local_200.ptr & 0xffffffffffffff00);
    kj::_::Mutex::lock(&pMVar4->mutex,0);
    local_1f0 = &pMVar4->value;
    local_200.ptr = (PromiseNode *)&PTR_check_0062f290;
    local_1f8 = &local_219;
    local_1a8[0].exception._0_1_ = 0;
    kj::_::Mutex::wait(&pMVar4->mutex,&local_200);
    kj::_::Mutex::unlock(&pMVar4->mutex,EXCLUSIVE,(Waiter *)0x0);
    plVar5 = local_208;
    if (local_208 != (long *)0x0) {
      local_208 = (long *)0x0;
      (**(local_210->super_Disposer)._vptr_Disposer)
                (local_210,(long)plVar5 + *(long *)(*plVar5 + -0x10));
    }
    node.node.ptr = local_218.node.ptr;
    if (local_218.node.ptr != (PromiseNode *)0x0) {
      local_218.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
    }
    if (local_1b8 == 0) {
      EventLoop::leaveScope(local_1c8);
    }
    EventLoop::~EventLoop(&local_198);
    UnixEventPort::~UnixEventPort(&local_120);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
            (local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
             ,0x78,FAILED,"paf.promise.wait(waitScope) == 123","_kjCondition,",
             (DebugComparison<unsigned_int,_int> *)&local_200);
  kj::_::Debug::Fault::fatal(local_1a8);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }